

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderHelperInvocationTests::init
          (ShaderHelperInvocationTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  PrimitiveType primType;
  Context *pCVar4;
  anon_struct_16_2_b755e78b *paVar5;
  TestNode *pTVar6;
  TestCase *this_00;
  TestNode *node;
  HelperInvocationDerivateCase *pHVar7;
  long lVar8;
  long lVar9;
  uint in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60;
  allocator<char> local_99;
  TestNode *local_98;
  TestNode *local_90;
  anon_struct_16_2_b755e78b *local_88;
  long local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string name;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"value",
             "gl_HelperInvocation value in rendered pixels");
  local_98 = (TestNode *)this;
  local_90 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    local_88 = init::s_sampleCounts + lVar8;
    lVar9 = 8;
    while (paVar5 = local_88, lVar9 != 0x58) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,*(char **)(&UNK_01e61028 + lVar9),&local_99);
      std::operator+(&name,&local_78,paVar5->suffix);
      std::__cxx11::string::~string((string *)&local_78);
      uVar1 = *(undefined4 *)((long)&init::s_primTypes[0].caseName + lVar9);
      iVar2 = paVar5->numSamples;
      local_80 = lVar9;
      this_00 = (TestCase *)operator_new(0xb0);
      gles31::TestCase::TestCase
                (this_00,(Context *)local_98[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1);
      (this_00->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__HelperInvocationValueCase_01e610e8;
      *(undefined4 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      *(int *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar2;
      this_00[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0xa00000005;
      this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
      *(undefined4 *)&this_00[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
      tcu::TestNode::addChild(local_90,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&name);
      lVar9 = local_80 + 0x10;
    }
  }
  node = (TestNode *)operator_new(0x70);
  pTVar6 = local_98;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,local_98->m_testCtx,"derivate",
             "Derivate of gl_HelperInvocation-dependent value");
  tcu::TestNode::addChild(pTVar6,node);
  for (local_90 = (TestNode *)0x0; local_90 != (TestNode *)0x4;
      local_90 = (TestNode *)((long)local_90 + 1)) {
    local_88 = init::s_sampleCounts + (long)local_90;
    lVar8 = 8;
    while (paVar5 = local_88, lVar8 != 0x58) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,*(char **)(&UNK_01e61028 + lVar8),&local_99);
      std::operator+(&name,&local_78,paVar5->suffix);
      std::__cxx11::string::~string((string *)&local_78);
      uVar3 = *(uint *)((long)&init::s_primTypes[0].caseName + lVar8);
      primType = paVar5->numSamples;
      local_80 = lVar8;
      pHVar7 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)pTVar6[1]._vptr_TestNode;
      std::operator+(&local_78,&name,"_dfdx");
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar7,pCVar4,local_78._M_dataplus._M_p,(char *)(ulong)uVar3,primType,0x184160c,
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,1),(bool)in_stack_ffffffffffffff60);
      tcu::TestNode::addChild(node,(TestNode *)pHVar7);
      std::__cxx11::string::~string((string *)&local_78);
      pHVar7 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)local_98[1]._vptr_TestNode;
      std::operator+(&local_78,&name,"_dfdy");
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar7,pCVar4,local_78._M_dataplus._M_p,(char *)(ulong)uVar3,primType,0x1841624,
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,1),(bool)in_stack_ffffffffffffff60);
      tcu::TestNode::addChild(node,(TestNode *)pHVar7);
      std::__cxx11::string::~string((string *)&local_78);
      pHVar7 = (HelperInvocationDerivateCase *)operator_new(0xd0);
      pCVar4 = (Context *)local_98[1]._vptr_TestNode;
      std::operator+(&local_78,&name,"_fwidth");
      anon_unknown_1::HelperInvocationDerivateCase::HelperInvocationDerivateCase
                (pHVar7,pCVar4,local_78._M_dataplus._M_p,(char *)(ulong)uVar3,primType,0x18d7ba9,
                 (char *)((ulong)in_stack_ffffffffffffff5c << 0x20),(bool)in_stack_ffffffffffffff60)
      ;
      tcu::TestNode::addChild(node,(TestNode *)pHVar7);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&name);
      pTVar6 = local_98;
      lVar8 = local_80 + 0x10;
    }
  }
  return 4;
}

Assistant:

void ShaderHelperInvocationTests::init (void)
{
	static const struct
	{
		const char*		caseName;
		PrimitiveType	primType;
	} s_primTypes[] =
	{
		{ "triangles",		PRIMITIVETYPE_TRIANGLE		},
		{ "lines",			PRIMITIVETYPE_LINE			},
		{ "wide_lines",		PRIMITIVETYPE_WIDE_LINE		},
		{ "points",			PRIMITIVETYPE_POINT			},
		{ "wide_points",	PRIMITIVETYPE_WIDE_POINT	}
	};

	static const struct
	{
		const char*		suffix;
		int				numSamples;
	} s_sampleCounts[] =
	{
		{ "",					0				},
		{ "_4_samples",			4				},
		{ "_8_samples",			8				},
		{ "_max_samples",		NUM_SAMPLES_MAX	}
	};

	// value
	{
		tcu::TestCaseGroup* const valueGroup = new tcu::TestCaseGroup(m_testCtx, "value", "gl_HelperInvocation value in rendered pixels");
		addChild(valueGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				valueGroup->addChild(new HelperInvocationValueCase(m_context, name.c_str(), "", primType, numSamples));
			}
		}
	}

	// derivate
	{
		tcu::TestCaseGroup* const derivateGroup = new tcu::TestCaseGroup(m_testCtx, "derivate", "Derivate of gl_HelperInvocation-dependent value");
		addChild(derivateGroup);

		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(s_sampleCounts); sampleCountNdx++)
		{
			for (int primTypeNdx = 0; primTypeNdx < DE_LENGTH_OF_ARRAY(s_primTypes); primTypeNdx++)
			{
				const string		name		= string(s_primTypes[primTypeNdx].caseName) + s_sampleCounts[sampleCountNdx].suffix;
				const PrimitiveType	primType	= s_primTypes[primTypeNdx].primType;
				const int			numSamples	= s_sampleCounts[sampleCountNdx].numSamples;

				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdx").c_str(),	"", primType, numSamples, "dFdx",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_dfdy").c_str(),	"", primType, numSamples, "dFdy",	true));
				derivateGroup->addChild(new HelperInvocationDerivateCase(m_context, (name + "_fwidth").c_str(),	"", primType, numSamples, "fwidth",	false));
			}
		}
	}
}